

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O3

VirtualPage * __thiscall
sai::VirtualFileEntry::GetTablePage
          (VirtualPage *__return_storage_ptr__,VirtualFileEntry *this,size_t Index)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Atomic_word _Var3;
  bool bVar4;
  
  memset(__return_storage_ptr__,0,0x1000);
  this_00 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3 = this_00->_M_use_count;
    do {
      if (_Var3 == 0) {
        return __return_storage_ptr__;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = _Var3 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = _Var3 + 1;
        iVar1 = _Var3;
      }
      _Var3 = iVar1;
      UNLOCK();
    } while (!bVar4);
    peVar2 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0 && this_00->_M_use_count != 0) {
      std::istream::seekg((long)peVar2,(_Ios_Seekdir)((Index & 0xffffffffffe00) << 0xc));
      std::istream::read((char *)peVar2,(long)__return_storage_ptr__);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

VirtualPage VirtualFileEntry::GetTablePage(std::size_t Index) const
{
	VirtualPage TablePage = {};
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		Stream->seekg(VirtualPage::NearestTableIndex(Index) * VirtualPage::PageSize, std::ios::beg);
		Stream->read(reinterpret_cast<char*>(TablePage.u8.data()), VirtualPage::PageSize);
	}
	return TablePage;
}